

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_logic.cc
# Opt level: O2

bool __thiscall
CLogicSocket::_HandleRegister
          (CLogicSocket *this,lp_connection_t pConn,LPSTRUC_MSG_HEADER pMsgHeader,char *pPkgBody,
          unsigned_short iBodyLength)

{
  size_t sVar1;
  size_t sVar2;
  uint uVar3;
  CMemory *this_00;
  CCRC32 *this_01;
  char *psendbuf;
  ushort uVar4;
  SourceFile file;
  MutexLockGuard lock;
  undefined1 local_1018 [12];
  Logger local_1008;
  
  if (muduo::g_logLevel < 3) {
    muduo::Logger::SourceFile::SourceFile<101>
              ((SourceFile *)local_1018,
               (char (*) [101])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/logic/flyd_logic.cc"
              );
    file._12_4_ = 0;
    file.data_ = (char *)local_1018._0_8_;
    file.size_ = local_1018._8_4_;
    muduo::Logger::Logger(&local_1008,file,0x9c);
    muduo::LogStream::operator<<(&local_1008.impl_.stream_,anon_var_dwarf_36cdb);
    muduo::Logger::~Logger(&local_1008);
  }
  if (iBodyLength == 100 && pPkgBody != (char *)0x0) {
    local_1008.impl_.time_.microSecondsSinceEpoch_ = (int64_t)&pConn->logicPorcMutex;
    muduo::MutexLock::lock((MutexLock *)local_1008.impl_.time_.microSecondsSinceEpoch_);
    this_00 = CMemory::GetInstance();
    this_01 = CCRC32::GetInstance();
    psendbuf = (char *)CMemory::AllocMemory
                                 (this_00,(int)(this->super_CSocekt).m_iLenPkgHeader +
                                          (int)(this->super_CSocekt).m_iLenMsgHeader + 65000,false);
    memcpy(psendbuf,pMsgHeader,(this->super_CSocekt).m_iLenMsgHeader);
    sVar1 = (this->super_CSocekt).m_iLenMsgHeader;
    (psendbuf + sVar1 + 2)[0] = '\0';
    (psendbuf + sVar1 + 2)[1] = '\x05';
    sVar2 = (this->super_CSocekt).m_iLenPkgHeader;
    uVar4 = (short)sVar2 - 0x218;
    *(ushort *)(psendbuf + sVar1) = uVar4 * 0x100 | uVar4 >> 8;
    uVar3 = CCRC32::Get_CRC(this_01,(uchar *)(psendbuf + sVar2 + sVar1),65000);
    *(uint *)(psendbuf + sVar1 + 4) =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    CSocekt::msgSend(&this->super_CSocekt,psendbuf);
    muduo::MutexLockGuard::~MutexLockGuard((MutexLockGuard *)&local_1008);
  }
  return iBodyLength == 100 && pPkgBody != (char *)0x0;
}

Assistant:

bool CLogicSocket::_HandleRegister(lp_connection_t pConn,LPSTRUC_MSG_HEADER pMsgHeader,char *pPkgBody,unsigned short iBodyLength)
{
    LOG_INFO << "执行了CLogicSocket::_HandleRegister()!";
     //(1)首先判断包体的合法性
    if(pPkgBody == NULL) //具体看客户端服务器约定，如果约定这个命令[msgCode]必须带包体，那么如果不带包体，就认为是恶意包，直接不处理    
    {        
        return false;
    }
		    
    int iRecvLen = sizeof(STRUCT_REGISTER); 
    if(iRecvLen != iBodyLength) //发送过来的结构大小不对，认为是恶意包，直接不处理
    {     
        return false; 
    }

    //(2)对于同一个用户，可能同时发送来多个请求过来，造成多个线程同时为该 用户服务，比如以网游为例，用户要在商店中买A物品，又买B物品，而用户的钱 只够买A或者B，不够同时买A和B呢？
       //那如果用户发送购买命令过来买了一次A，又买了一次B，如果是两个线程来执行同一个用户的这两次不同的购买命令，很可能造成这个用户购买成功了 A，又购买成功了 B
       //所以，为了稳妥起见，针对某个用户的命令，我们一般都要互斥,我们需要增加临界的变量于ngx_connection_s结构中
  //  CLock lock(&pConn->logicPorcMutex); //凡是和本用户有关的访问都互斥
    muduo::MutexLockGuard  lock(pConn->logicPorcMutex);
    
    //(3)取得了整个发送过来的数据
    LPSTRUCT_REGISTER p_RecvInfo = (LPSTRUCT_REGISTER)pPkgBody; 

    //(4)这里可能要考虑 根据业务逻辑，进一步判断收到的数据的合法性，
       //当前该玩家的状态是否适合收到这个数据等等【比如如果用户没登陆，它就不适合购买物品等等】
        //这里大家自己发挥，自己根据业务需要来扩充代码，老师就不带着大家扩充了。。。。。。。。。。。。
    //。。。。。。。。

    //(5)给客户端返回数据时，一般也是返回一个结构，这个结构内容具体由客户端/服务器协商，这里我们就以给客户端也返回同样的 STRUCT_REGISTER 结构来举例    
    //LPSTRUCT_REGISTER pFromPkgHeader =  (LPSTRUCT_REGISTER)(((char *)pMsgHeader)+m_iLenMsgHeader);	//指向收到的包的包头，其中数据后续可能要用到
	LPCOMM_PKG_HEADER pPkgHeader;	
	CMemory  *p_memory = CMemory::GetInstance();
	CCRC32   *p_crc32 = CCRC32::GetInstance();
    int iSendLen = sizeof(STRUCT_REGISTER);  
    //a)分配要发送出去的包的内存

    iSendLen = 65000; //unsigned最大也就是这个值
    char *p_sendbuf = (char *)p_memory->AllocMemory(m_iLenMsgHeader+m_iLenPkgHeader+iSendLen,false);//准备发送的格式，这里是 消息头+包头+包体
    //b)填充消息头
    memcpy(p_sendbuf,pMsgHeader,m_iLenMsgHeader);                   //消息头直接拷贝到这里来
    //c)填充包头
    pPkgHeader = (LPCOMM_PKG_HEADER)(p_sendbuf+m_iLenMsgHeader);    //指向包头
    pPkgHeader->msgCode = _CMD_REGISTER;	                        //消息代码，可以统一在ngx_logiccomm.h中定义
    pPkgHeader->msgCode = htons(pPkgHeader->msgCode);	            //htons主机序转网络序 
    pPkgHeader->pkgLen  = htons(m_iLenPkgHeader + iSendLen);        //整个包的尺寸【包头+包体尺寸】 
    //d)填充包体
    LPSTRUCT_REGISTER p_sendInfo = (LPSTRUCT_REGISTER)(p_sendbuf+m_iLenMsgHeader+m_iLenPkgHeader);	//跳过消息头，跳过包头，就是包体了
    //。。。。。这里根据需要，填充要发回给客户端的内容,int类型要使用htonl()转，short类型要使用htons()转；
    
    //e)包体内容全部确定好后，计算包体的crc32值
    pPkgHeader->crc32   = p_crc32->Get_CRC((unsigned char *)p_sendInfo,iSendLen);
    pPkgHeader->crc32   = htonl(pPkgHeader->crc32);		

    //f)发送数据包
    msgSend(p_sendbuf);

    return true;
}